

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

void secp256k1_musig_nonce_process_internal
               (int *fin_nonce_parity,uchar *fin_nonce,secp256k1_scalar *b,
               secp256k1_ge *aggnonce_pts,uchar *agg_pk32,uchar *msg)

{
  int iVar1;
  int *in_RDI;
  secp256k1_gej fin_nonce_ptj;
  secp256k1_ge fin_nonce_pt;
  uchar noncehash [32];
  secp256k1_fe *in_stack_fffffffffffffea8;
  int *in_stack_fffffffffffffeb0;
  uchar *in_stack_fffffffffffffeb8;
  secp256k1_scalar *in_stack_fffffffffffffec0;
  secp256k1_gej *in_stack_ffffffffffffff08;
  secp256k1_ge *in_stack_ffffffffffffff10;
  uchar *in_stack_ffffffffffffff38;
  secp256k1_scalar *in_stack_ffffffffffffff40;
  secp256k1_ge *in_stack_ffffffffffffff48;
  secp256k1_gej *in_stack_ffffffffffffff50;
  
  secp256k1_musig_compute_noncehash
            ((uchar *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (uchar *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  secp256k1_scalar_set_b32
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  secp256k1_effective_nonce
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  secp256k1_ge_set_gej(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x10c95a);
  if (iVar1 != 0) {
    memcpy(&stack0xffffffffffffff40,&secp256k1_ge_const_g,0x68);
  }
  secp256k1_fe_normalize_var((secp256k1_fe *)0x10c985);
  secp256k1_fe_get_b32((uchar *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  secp256k1_fe_normalize_var((secp256k1_fe *)0x10c9ab);
  iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)0x10c9bc);
  *in_RDI = iVar1;
  return;
}

Assistant:

static void secp256k1_musig_nonce_process_internal(int *fin_nonce_parity, unsigned char *fin_nonce, secp256k1_scalar *b, secp256k1_ge *aggnonce_pts, const unsigned char *agg_pk32, const unsigned char *msg) {
    unsigned char noncehash[32];
    secp256k1_ge fin_nonce_pt;
    secp256k1_gej fin_nonce_ptj;

    secp256k1_musig_compute_noncehash(noncehash, aggnonce_pts, agg_pk32, msg);
    secp256k1_scalar_set_b32(b, noncehash, NULL);
    /* fin_nonce = aggnonce_pts[0] + b*aggnonce_pts[1] */
    secp256k1_effective_nonce(&fin_nonce_ptj, aggnonce_pts, b);
    secp256k1_ge_set_gej(&fin_nonce_pt, &fin_nonce_ptj);
    if (secp256k1_ge_is_infinity(&fin_nonce_pt)) {
        fin_nonce_pt = secp256k1_ge_const_g;
    }
    /* fin_nonce_pt is not the point at infinity */
    secp256k1_fe_normalize_var(&fin_nonce_pt.x);
    secp256k1_fe_get_b32(fin_nonce, &fin_nonce_pt.x);
    secp256k1_fe_normalize_var(&fin_nonce_pt.y);
    *fin_nonce_parity = secp256k1_fe_is_odd(&fin_nonce_pt.y);
}